

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_indexer_impl.h
# Opt level: O2

void node::fill_ln(vector<int,_std::allocator<int>_> *prel_to_ln,
                  vector<int,_std::allocator<int>_> *prer_to_ln,
                  vector<int,_std::allocator<int>_> *prel_to_size,
                  vector<int,_std::allocator<int>_> *prer_to_prel)

{
  int *piVar1;
  pointer piVar2;
  pointer piVar3;
  pointer piVar4;
  ulong uVar5;
  int i;
  ulong uVar6;
  ulong uVar7;
  
  piVar1 = (prel_to_size->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (prel_to_ln->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (prer_to_ln->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (prer_to_prel->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = 0xffffffffffffffff;
  uVar7 = 0xffffffff;
  for (uVar6 = 0; (long)uVar6 < (long)*piVar1; uVar6 = uVar6 + 1) {
    piVar2[uVar6] = (int)uVar5;
    if (piVar1[uVar6] == 1) {
      uVar5 = uVar6;
    }
    uVar5 = uVar5 & 0xffffffff;
    piVar3[uVar6] = (int)uVar7;
    if (piVar1[piVar4[uVar6]] == 1) {
      uVar7 = uVar6 & 0xffffffff;
    }
  }
  return;
}

Assistant:

void fill_ln(std::vector<int>& prel_to_ln,
    std::vector<int>& prer_to_ln,
    const std::vector<int>& prel_to_size,
    const std::vector<int>& prer_to_prel) {
  int current_leaf_prel = -1;
  int current_leaf_prer = -1;
  for(int i = 0; i < prel_to_size[0]; ++i) {
    prel_to_ln[i] = current_leaf_prel;
    if(prel_to_size[i] == 1) {
      current_leaf_prel = i;
    }
    prer_to_ln[i] = current_leaf_prer;
    if(prel_to_size[prer_to_prel[i]] == 1) {
      current_leaf_prer = i;
    }
  }
}